

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

Location * __thiscall c4::yml::Parser::location(Parser *this,ConstNodeRef node)

{
  bool bVar1;
  error_flags eVar2;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  Location *in_RDI;
  char msg [29];
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  char *in_stack_ffffffffffffff38;
  Location *in_stack_ffffffffffffff40;
  code *in_stack_ffffffffffffff50;
  Tree *tree;
  undefined7 in_stack_ffffffffffffff60;
  undefined1 uVar3;
  char local_58 [48];
  Tree *local_18;
  undefined1 *local_10;
  undefined1 *local_8;
  
  tree = (Tree *)&stack0xffffffffffffffd8;
  uVar3 = in_RDX != 0 && in_RCX != -1;
  local_18 = tree;
  if (in_RDX == 0 || in_RCX == -1) {
    builtin_strncpy(local_58,"check failed: (node.valid())",0x1d);
    eVar2 = get_error_flags();
    if (((eVar2 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
      trap_instruction();
    }
    in_stack_ffffffffffffff50 = *(code **)(in_RSI + 0x9e8);
    Location::Location(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
                       CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                       CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                       CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
    (*in_stack_ffffffffffffff50)(local_58,0x1d,*(undefined8 *)(in_RSI + 0x9d0));
  }
  local_10 = &stack0xffffffffffffffd8;
  local_8 = &stack0xffffffffffffffd8;
  location((Parser *)CONCAT17(uVar3,in_stack_ffffffffffffff60),tree,
           (size_t)in_stack_ffffffffffffff50);
  return in_RDI;
}

Assistant:

Location Parser::location(ConstNodeRef node) const
{
    _RYML_CB_ASSERT(m_stack.m_callbacks, node.valid());
    return location(*node.tree(), node.id());
}